

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O3

void __thiscall ipx::Iterate::ComputeObjectives(Iterate *this)

{
  Vector *x;
  int iVar1;
  int iVar2;
  StateDetail SVar3;
  Model *pMVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  pointer pSVar9;
  pointer piVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  pMVar4 = this->model_;
  iVar1 = pMVar4->num_rows_;
  iVar2 = pMVar4->num_cols_;
  x = &pMVar4->b_;
  if (this->postprocessed_ == true) {
    this->offset_ = 0.0;
    dVar17 = pMVar4->offset_;
    dVar14 = Dot(&pMVar4->c_,&this->x_);
    this->pobjective_ = dVar14 + dVar17;
    dVar17 = this->model_->offset_;
    dVar14 = Dot(x,&this->y_);
    dVar14 = dVar14 + dVar17;
    this->dobjective_ = dVar14;
    uVar11 = iVar2 + iVar1;
    if (uVar11 != 0 && SCARRY4(iVar2,iVar1) == (int)uVar11 < 0) {
      pdVar5 = (pMVar4->lb_)._M_data;
      pdVar6 = (pMVar4->ub_)._M_data;
      pdVar7 = (this->zl_)._M_data;
      pdVar8 = (this->zu_)._M_data;
      uVar12 = 0;
      do {
        dVar17 = pdVar5[uVar12];
        if ((ulong)ABS(dVar17) < 0x7ff0000000000000) {
          dVar14 = dVar14 + dVar17 * pdVar7[uVar12];
          this->dobjective_ = dVar14;
        }
        dVar17 = pdVar6[uVar12];
        if ((ulong)ABS(dVar17) < 0x7ff0000000000000) {
          dVar14 = dVar14 - dVar17 * pdVar8[uVar12];
          this->dobjective_ = dVar14;
        }
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
  }
  else {
    this->offset_ = 0.0;
    dVar17 = pMVar4->offset_;
    this->pobjective_ = dVar17;
    uVar11 = iVar2 + iVar1;
    if (uVar11 == 0 || SCARRY4(iVar2,iVar1) != (int)uVar11 < 0) {
      dVar14 = Dot(x,&this->y_);
      this->dobjective_ = dVar17 + dVar14;
    }
    else {
      pSVar9 = (this->variable_state_).
               super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (this->x_)._M_data;
      pdVar6 = (this->zl_)._M_data;
      pdVar7 = (this->zu_)._M_data;
      pdVar8 = (pMVar4->c_)._M_data;
      dVar15 = 0.0;
      uVar12 = 0;
      dVar14 = dVar17;
      do {
        SVar3 = pSVar9[uVar12];
        dVar16 = pdVar8[uVar12] * pdVar5[uVar12];
        if (SVar3 == FIXED) {
LAB_0039f024:
          dVar15 = dVar15 + dVar16;
          this->offset_ = dVar15;
        }
        else {
          dVar14 = dVar16 + dVar14;
          this->pobjective_ = dVar14;
          if (SVar3 - IMPLIED_LB < 3) {
            dVar14 = dVar14 - (pdVar6[uVar12] - pdVar7[uVar12]) * pdVar5[uVar12];
            this->pobjective_ = dVar14;
            dVar16 = (pdVar6[uVar12] - pdVar7[uVar12]) * pdVar5[uVar12];
            goto LAB_0039f024;
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
      dVar14 = Dot(x,&this->y_);
      dVar17 = dVar17 + dVar14;
      this->dobjective_ = dVar17;
      if (0 < (int)uVar11) {
        pSVar9 = (this->variable_state_).
                 super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar5 = (this->zl_)._M_data;
        pdVar6 = (this->zu_)._M_data;
        pdVar7 = (this->x_)._M_data;
        pdVar8 = (this->y_)._M_data;
        uVar12 = 0;
        do {
          SVar3 = pSVar9[uVar12];
          if ((SVar3 & ~BARRIER_BOXED) == BARRIER_LB) {
            dVar17 = dVar17 + (pMVar4->lb_)._M_data[uVar12] * pdVar5[uVar12];
            this->dobjective_ = dVar17;
          }
          if (SVar3 - BARRIER_UB < 2) {
            dVar14 = (pMVar4->ub_)._M_data[uVar12];
            dVar15 = pdVar6[uVar12];
LAB_0039f0c3:
            dVar17 = dVar17 - dVar14 * dVar15;
            this->dobjective_ = dVar17;
          }
          else if (SVar3 == FIXED) {
            dVar14 = pdVar7[uVar12];
            piVar10 = (pMVar4->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar1 = piVar10[uVar12];
            lVar13 = (long)iVar1;
            iVar2 = piVar10[uVar12 + 1];
            dVar15 = 0.0;
            if (iVar1 < iVar2) {
              do {
                dVar15 = dVar15 + pdVar8[(pMVar4->AI_).rowidx_.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[lVar13]] *
                                  (pMVar4->AI_).values_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar13];
                lVar13 = lVar13 + 1;
              } while (iVar2 != lVar13);
            }
            goto LAB_0039f0c3;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar11);
      }
    }
  }
  return;
}

Assistant:

void Iterate::ComputeObjectives() const {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& b = model_.b();
    const Vector& c = model_.c();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    const SparseMatrix& AI = model_.AI();

    if (postprocessed_) {
        // Compute objective values as defined for the LP model.
        offset_ = 0.0;
        pobjective_ = model_.offset() + Dot(c, x_);
        dobjective_ = model_.offset() + Dot(b, y_);
        for (Int j = 0; j < n+m; j++) {
            if (std::isfinite(lb[j]))
                dobjective_ += lb[j] * zl_[j];
            if (std::isfinite(ub[j]))
                dobjective_ -= ub[j] * zu_[j];
        }
    } else {
        // Compute objective values for the LP that is solved at the very moment
        // (after fixing and implying variables). The offset is such that
        // pobjective_ + offset_ is the primal objective after postprocessing.
        offset_ = 0.0;
        pobjective_ = model_.offset();
        for (Int j = 0; j < n+m; j++) {
            if (StateOf(j) != State::fixed)
                pobjective_ += c[j] * x_[j];
            else
                offset_ += c[j] * x_[j];
            if (is_implied(j)) {
                // At the moment, we are solving an LP with the cost coefficient
                // for variable j decreased by zl[j]-zu[j].
                pobjective_ -= (zl_[j]-zu_[j]) * x_[j];
                offset_ += (zl_[j]-zu_[j]) * x_[j];
            }
        }
        dobjective_ = model_.offset() + Dot(b, y_);
        for (Int j = 0; j < n+m; j++) {
            if (has_barrier_lb(j))
                dobjective_ += lb[j] * zl_[j];
            if (has_barrier_ub(j))
                dobjective_ -= ub[j] * zu_[j];
            if (StateOf(j) == State::fixed)
                // At the moment, we are solving the LP without variable j,
                // but with the RHS decreased by AI[:,j]*x[j].
                dobjective_ -= x_[j] * DotColumn(AI, j, y_);
        }
    }
}